

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2ktx2.cpp
# Opt level: O0

bool __thiscall ktxUpgrader::processOption(ktxUpgrader *this,argparser *parser,int opt)

{
  int iVar1;
  long lVar2;
  int in_EDX;
  string *in_RSI;
  long in_RDI;
  size_t dot;
  
  if (in_EDX == 0x62) {
    *(undefined1 *)(in_RDI + 0xbe) = 1;
  }
  else if (in_EDX == 0x66) {
    *(undefined1 *)(in_RDI + 0xbd) = 1;
  }
  else {
    if (in_EDX != 0x6f) {
      return false;
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 0x90),in_RSI);
    iVar1 = std::__cxx11::string::compare((char *)(in_RDI + 0x90));
    if (iVar1 == 0) {
      *(undefined1 *)(in_RDI + 0xbc) = 1;
    }
    else {
      lVar2 = std::__cxx11::string::find_last_of((char)in_RDI + -0x70,0x2e);
      if (lVar2 == -1) {
        std::__cxx11::string::operator+=((string *)(in_RDI + 0x90),".ktx2");
      }
    }
  }
  return true;
}

Assistant:

bool
ktxUpgrader::processOption(argparser& parser, int opt)
{
    switch (opt) {
      case 'b':
        options.rewriteBadOrientation = true;
        break;
     case 'f':
        options.force = true;
        break;
     case 'o':
        options.outfile = parser.optarg;
        if (!options.outfile.compare("stdout")) {
            options.useStdout = true;
        } else {
            size_t dot;
            dot = options.outfile.find_last_of('.');
            if (dot ==string::npos) {
                options.outfile += ".ktx2";
            }
        }
        break;
      default:
        return false;
    }
    return true;
}